

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

QString * waitForError<int,QString>
                    (QString *__return_storage_ptr__,QPromise<int> *promise,QString *initial)

{
  QSharedData *pQVar1;
  Data *pDVar2;
  PromiseData<int> *pPVar3;
  Data *pDVar4;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> QVar5;
  bool bVar6;
  PromiseData<int> *this;
  QSharedData *pQVar7;
  QPromiseReject<int> *in_R8;
  PromiseResolver<int> resolver;
  Data *local_a8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_a0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_98;
  QString *local_90;
  QPromise<int> local_88;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_50;
  code *local_40;
  
  pDVar2 = (initial->d).d;
  (__return_storage_ptr__->d).d = pDVar2;
  (__return_storage_ptr__->d).ptr = (initial->d).ptr;
  (__return_storage_ptr__->d).size = (initial->d).size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_90 = __return_storage_ptr__;
  this = (PromiseData<int> *)operator_new(0x68);
  (this->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(this->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (this->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(this->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(this->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (this->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_0011fb48;
  QReadWriteLock::QReadWriteLock(&(this->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_0011fad0;
  (this->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar7 = &(this->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  pQVar7 = &(this->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar7 = &(this->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  local_88.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011fa98;
  local_88.super_QPromiseBase<int>.m_d.d = this;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver
            ((PromiseResolver<int> *)&local_a0,&local_88);
  local_88.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011fa68;
  if (local_88.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_88.super_QPromiseBase<int>.m_d.d)->
              super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_88.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_88.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (local_a0.d != (Data *)0x0) {
    LOCK();
    ((local_a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_a8 = local_a0.d;
  if (local_a0.d != (Data *)0x0) {
    LOCK();
    ((local_a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_98.d = local_a0.d;
  pPVar3 = (promise->super_QPromiseBase<int>).m_d.d;
  QtPromisePrivate::PromiseHandler<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_int_&)> *)&local_50,
             (PromiseHandler<int,decltype(nullptr),void> *)0x0,&local_a8,
             (QPromiseResolve<int> *)&local_98,in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&pPVar3->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  QVar5.d = local_98.d;
  pDVar4 = local_a8;
  pPVar3 = (promise->super_QPromiseBase<int>).m_d.d;
  if (local_a8 != (Data *)0x0) {
    LOCK();
    (local_a8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (local_a8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_98.d != (Data *)0x0) {
    LOCK();
    ((local_98.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_98.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x18);
  *(Data **)local_78._M_unused._0_8_ = pDVar4;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(Data **)((long)local_78._M_unused._0_8_ + 8) = QVar5.d;
  if (QVar5.d == (Data *)0x0) {
    *(QString **)((long)local_78._M_unused._0_8_ + 0x10) = local_90;
    pcStack_60 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    ((QVar5.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar5.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(QString **)((long)local_78._M_unused._0_8_ + 0x10) = local_90;
    pcStack_60 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
               ::_M_manager;
    LOCK();
    ((QVar5.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar5.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar5.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar5.d,0x10);
    }
  }
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(pDVar4,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&pPVar3->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_98.d != (Data *)0x0) {
    LOCK();
    ((local_98.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_98.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if (((__int_type)
         ((local_98.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
       (local_98.d != (Data *)0x0)) {
      operator_delete(local_98.d,0x10);
    }
  }
  if (local_a8 != (Data *)0x0) {
    LOCK();
    (local_a8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (local_a8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i == 0) && (local_a8 != (Data *)0x0)) {
      operator_delete(local_a8,0x10);
    }
  }
  if (local_a0.d != (Data *)0x0) {
    LOCK();
    ((local_a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((local_a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_a0.d != (Data *)0x0)) {
      operator_delete(local_a0.d,0x10);
    }
  }
  bVar6 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&((promise->super_QPromiseBase<int>).m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar6) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&((promise->super_QPromiseBase<int>).m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  bVar6 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    ((PromiseDataBase<int,_void_(const_int_&)> *)this);
  while (bVar6 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar6 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      ((PromiseDataBase<int,_void_(const_int_&)> *)this);
  }
  LOCK();
  (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this);
  }
  LOCK();
  (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this);
  }
  return local_90;
}

Assistant:

static inline E waitForError(const QtPromise::QPromise<T>& promise, const E& initial)
{
    E error(initial);
    promise
        .fail([&](const E& err) {
            error = err;
            return T();
        })
        .wait();
    return error;
}